

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFileSetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallFileSetGenerator::~cmInstallFileSetGenerator(cmInstallFileSetGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallFileSetGenerator_008d0e48;
  pcVar2 = (this->FilePermissions)._M_dataplus._M_p;
  paVar1 = &(this->FilePermissions).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->TargetName)._M_dataplus._M_p;
  paVar1 = &(this->TargetName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  cmInstallGenerator::~cmInstallGenerator(&this->super_cmInstallGenerator);
  return;
}

Assistant:

bool cmInstallFileSetGenerator::Compute(cmLocalGenerator* lg)
{
  this->LocalGenerator = lg;

  // Lookup this target in the current directory.
  this->Target = lg->FindLocalNonAliasGeneratorTarget(this->TargetName);
  if (!this->Target) {
    // If no local target has been found, find it in the global scope.
    this->Target =
      lg->GetGlobalGenerator()->FindGeneratorTarget(this->TargetName);
  }

  return true;
}